

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainEth1394.cpp
# Opt level: O0

void WriteAllBoardsTest(BasePort *port,vector<AmpIO_*,_std::allocator<AmpIO_*>_> *boardList)

{
  AmpIO *this;
  byte bVar1;
  ProtocolType PVar2;
  ostream *this_00;
  void *this_01;
  size_type sVar3;
  reference ppAVar4;
  uint local_20;
  uint local_1c;
  int axis;
  uint j;
  vector<AmpIO_*,_std::allocator<AmpIO_*>_> *boardList_local;
  BasePort *port_local;
  
  this_00 = std::operator<<((ostream *)&std::cout,"Protocol: ");
  PVar2 = BasePort::GetProtocol(port);
  this_01 = (void *)std::ostream::operator<<(this_00,PVar2);
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  local_1c = 0;
  while( true ) {
    sVar3 = std::vector<AmpIO_*,_std::allocator<AmpIO_*>_>::size(boardList);
    if (sVar3 <= local_1c) break;
    ppAVar4 = std::vector<AmpIO_*,_std::allocator<AmpIO_*>_>::operator[](boardList,(ulong)local_1c);
    AmpIO::WritePowerEnable(*ppAVar4,true);
    ppAVar4 = std::vector<AmpIO_*,_std::allocator<AmpIO_*>_>::operator[](boardList,(ulong)local_1c);
    AmpIO::SetAmpEnableMask(*ppAVar4,0xf,0xf);
    ppAVar4 = std::vector<AmpIO_*,_std::allocator<AmpIO_*>_>::operator[](boardList,(ulong)local_1c);
    AmpIO::SetSafetyRelay(*ppAVar4,true);
    for (local_20 = 0; (int)local_20 < 4; local_20 = local_20 + 1) {
      ppAVar4 = std::vector<AmpIO_*,_std::allocator<AmpIO_*>_>::operator[]
                          (boardList,(ulong)local_1c);
      this = *ppAVar4;
      ppAVar4 = std::vector<AmpIO_*,_std::allocator<AmpIO_*>_>::operator[]
                          (boardList,(ulong)local_1c);
      bVar1 = BoardIO::GetBoardId((BoardIO *)*ppAVar4);
      AmpIO::SetMotorCurrent(this,local_20,(uint)bVar1 * 0x10 + 0x8000 + local_20);
    }
    local_1c = local_1c + 1;
  }
  (*port->_vptr_BasePort[0x21])();
  return;
}

Assistant:

void  WriteAllBoardsTest(BasePort *port, std::vector<AmpIO *> &boardList)
{
    std::cout << "Protocol: " << port->GetProtocol() << std::endl;
    for (unsigned int j = 0; j < boardList.size(); j++) {
        boardList[j]->WritePowerEnable(true);
        boardList[j]->SetAmpEnableMask(0x0f, 0x0f);
        boardList[j]->SetSafetyRelay(true);
        for (int axis = 0; axis < 4; axis++)
            boardList[j]->SetMotorCurrent(axis, 0x8000+16*boardList[j]->GetBoardId()+axis);
    }
    port->WriteAllBoards();
}